

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphinx_fe.c
# Opt level: O0

int output_header_htk(sphinx_wave2feat_t *wtf,int32 nfloat)

{
  int iVar1;
  char *__s2;
  size_t sVar2;
  long lVar3;
  bool bVar4;
  double dVar5;
  ushort local_24;
  ushort local_22;
  int swap;
  int16 param_kind;
  int16 samp_size;
  int32 samp_period;
  int32 nfloat_local;
  sphinx_wave2feat_t *wtf_local;
  
  _param_kind = nfloat;
  _samp_period = wtf;
  __s2 = cmd_ln_str_r(wtf->config,"-mach_endian");
  iVar1 = strcmp("little",__s2);
  bVar4 = iVar1 == 0;
  if (bVar4) {
    _param_kind = (int)_param_kind >> 0x18 & 0xffU | (int)_param_kind >> 8 & 0xff00U |
                  (_param_kind & 0xff00) << 8 | _param_kind << 0x18;
  }
  sVar2 = fwrite(&param_kind,4,1,(FILE *)_samp_period->outfh);
  if (sVar2 == 1) {
    dVar5 = cmd_ln_float_r(_samp_period->config,"-frate");
    swap = (int)(1e+07 / (float)dVar5);
    if (bVar4) {
      swap = swap >> 0x18 & 0xffU | swap >> 8 & 0xff00U | (swap & 0xff00U) << 8 | swap << 0x18;
    }
    sVar2 = fwrite(&swap,4,1,(FILE *)_samp_period->outfh);
    if (sVar2 == 1) {
      local_22 = (ushort)(_samp_period->veclen << 2);
      if (bVar4) {
        local_22 = local_22 >> 8 | local_22 << 8;
      }
      sVar2 = fwrite(&local_22,2,1,(FILE *)_samp_period->outfh);
      if (sVar2 == 1) {
        lVar3 = cmd_ln_int_r(_samp_period->config,"-logspec");
        if ((lVar3 == 0) && (lVar3 = cmd_ln_int_r(_samp_period->config,"-cep2spec"), lVar3 == 0)) {
          local_24 = 0x2006;
        }
        else {
          local_24 = 7;
        }
        if (bVar4) {
          local_24 = local_24 >> 8 | local_24 << 8;
        }
        sVar2 = fwrite(&local_24,2,1,(FILE *)_samp_period->outfh);
        if (sVar2 == 1) {
          wtf_local._4_4_ = 0;
        }
        else {
          wtf_local._4_4_ = -1;
        }
      }
      else {
        wtf_local._4_4_ = -1;
      }
    }
    else {
      wtf_local._4_4_ = -1;
    }
  }
  else {
    wtf_local._4_4_ = -1;
  }
  return wtf_local._4_4_;
}

Assistant:

static int
output_header_htk(sphinx_wave2feat_t *wtf, int32 nfloat)
{
    int32 samp_period;
    int16 samp_size;
    int16 param_kind;
    int swap = FALSE;

    /* HTK files are big-endian. */
    if (0 == strcmp("little", cmd_ln_str_r(wtf->config, "-mach_endian")))
        swap = TRUE;
    /* Same file size thing as in Sphinx files (I think) */
    if (swap) SWAP_INT32(&nfloat);
    if (fwrite(&nfloat, 4, 1, wtf->outfh) != 1)
        return -1;
    /* Sample period in 100ns units. */
    samp_period = (int32)(1e+7 / cmd_ln_float32_r(wtf->config, "-frate"));
    if (swap) SWAP_INT32(&samp_period);
    if (fwrite(&samp_period, 4, 1, wtf->outfh) != 1)
        return -1;
    /* Sample size - veclen * sizeof each sample. */
    samp_size = wtf->veclen * 4;
    if (swap) SWAP_INT16(&samp_size);
    if (fwrite(&samp_size, 2, 1, wtf->outfh) != 1)
        return -1;
    /* Format and flags. */
    if (cmd_ln_boolean_r(wtf->config, "-logspec")
        || cmd_ln_boolean_r(wtf->config, "-cep2spec"))
        param_kind = FBANK; /* log mel-filter bank outputs */
    else
        param_kind = MFCC | _O; /* MFCC + CEP0 (note reordering...) */
    if (swap) SWAP_INT16(&param_kind);
    if (fwrite(&param_kind, 2, 1, wtf->outfh) != 1)
        return -1;

    return 0;
}